

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint _c;
  pointer pMVar6;
  size_t _elemsize;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  pointer pMVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  int iVar20;
  void *pvVar21;
  void *__src;
  long local_c8;
  ulong local_a0;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar6->dims;
  _elemsize = pMVar6->elemsize;
  pvVar7 = (this->slices).data;
  pvVar8 = (this->indices).data;
  if (uVar2 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar9 != 0) {
      uVar2 = pMVar6->w;
      uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar17 = 0;
      lVar9 = 0;
      iVar20 = 0;
      uVar18 = 0;
      do {
        if (pvVar8 == (void *)0x0) {
          iVar12 = *(int *)((long)pvVar7 + uVar18 * 4);
          if (iVar12 == -0xe9) {
            iVar12 = (int)((ulong)(long)(int)(uVar2 - iVar20) / (uVar10 + lVar9));
          }
        }
        else if (uVar18 == uVar10 - 1) {
          iVar12 = uVar2 - iVar20;
        }
        else {
          iVar12 = *(int *)((long)pvVar8 + uVar18 * 4);
          iVar12 = (iVar12 - iVar20) + (iVar12 >> 0x1f & uVar2);
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar17),iVar12,_elemsize,opt->blob_allocator);
        pvVar19 = *(void **)((long)&pMVar11->data + lVar17);
        if (pvVar19 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar17) * *(long *)((long)&pMVar11->cstep + lVar17)
            == 0) {
          return -100;
        }
        memcpy(pvVar19,(void *)((long)iVar20 * _elemsize + (long)pMVar6->data),
               (long)iVar12 * _elemsize);
        iVar20 = iVar20 + iVar12;
        uVar18 = uVar18 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar9 = lVar9 + -1;
        lVar17 = lVar17 + 0x48;
      } while (uVar18 < uVar10);
    }
  }
  else {
    iVar20 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar20 == 0)) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar20 = pMVar6->w;
        uVar2 = pMVar6->h;
        uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar17 = 0;
        lVar9 = 0;
        iVar12 = 0;
        uVar18 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar13 = *(int *)((long)pvVar7 + uVar18 * 4);
            if (iVar13 == -0xe9) {
              iVar13 = (int)((ulong)(long)(int)(uVar2 - iVar12) / (uVar10 + lVar9));
            }
          }
          else if (uVar18 == uVar10 - 1) {
            iVar13 = uVar2 - iVar12;
          }
          else {
            iVar13 = *(int *)((long)pvVar8 + uVar18 * 4);
            iVar13 = (iVar13 - iVar12) + (iVar13 >> 0x1f & uVar2);
          }
          Mat::create((Mat *)((long)&pMVar11->data + lVar17),iVar20,iVar13,_elemsize,
                      opt->blob_allocator);
          pvVar19 = *(void **)((long)&pMVar11->data + lVar17);
          if (pvVar19 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar11->c + lVar17) * *(long *)((long)&pMVar11->cstep + lVar17)
              == 0) {
            return -100;
          }
          memcpy(pvVar19,(void *)((long)iVar12 * (long)pMVar6->w * pMVar6->elemsize +
                                 (long)pMVar6->data),(long)(iVar13 * iVar20) * _elemsize);
          iVar12 = iVar12 + iVar13;
          uVar18 = uVar18 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
          lVar9 = lVar9 + -1;
          lVar17 = lVar17 + 0x48;
        } while (uVar18 < uVar10);
      }
    }
    else if ((uVar2 == 2) && (iVar20 == 1)) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        uVar2 = pMVar6->w;
        uVar3 = pMVar6->h;
        uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        iVar20 = 0;
        uVar18 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar12 = *(int *)((long)pvVar7 + uVar18 * 4);
            if (iVar12 == -0xe9) {
              iVar12 = (int)((ulong)(long)(int)(uVar2 - iVar20) / (uVar10 - uVar18));
            }
          }
          else if (uVar18 == uVar10 - 1) {
            iVar12 = uVar2 - iVar20;
          }
          else {
            iVar12 = *(int *)((long)pvVar8 + uVar18 * 4);
            iVar12 = (iVar12 - iVar20) + (iVar12 >> 0x1f & uVar2);
          }
          pMVar1 = pMVar11 + uVar18;
          Mat::create(pMVar1,iVar12,uVar3,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            uVar10 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * uVar10 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar6->data +
                             (long)iVar20 * _elemsize + (long)pMVar6->w * uVar10 * pMVar6->elemsize)
                     ,(long)iVar12 * _elemsize);
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
          }
          iVar20 = iVar20 + iVar12;
          uVar18 = uVar18 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar18 < uVar10);
        return 0;
      }
    }
    else if ((uVar2 - 3 < 2) && (iVar20 == 0)) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar20 = pMVar6->w;
        iVar12 = pMVar6->h;
        iVar13 = pMVar6->d;
        uVar3 = pMVar6->c;
        uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar9 = 0;
        local_c8 = 0;
        iVar16 = 0;
        uVar18 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar14 = *(int *)((long)pvVar7 + uVar18 * 4);
            if (iVar14 == -0xe9) {
              iVar14 = (int)((ulong)(long)(int)(uVar3 - iVar16) / (uVar10 + local_c8));
            }
          }
          else if (uVar18 == uVar10 - 1) {
            iVar14 = uVar3 - iVar16;
          }
          else {
            iVar14 = *(int *)((long)pvVar8 + uVar18 * 4);
            iVar14 = (iVar14 - iVar16) + (iVar14 >> 0x1f & uVar3);
          }
          Mat::create((Mat *)((long)&pMVar11->data + lVar9),iVar20,iVar12,iVar13,iVar14,_elemsize,
                      opt->blob_allocator);
          pvVar19 = *(void **)((long)&pMVar11->data + lVar9);
          if (pvVar19 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar11->c + lVar9) * *(long *)((long)&pMVar11->cstep + lVar9)
              == 0) {
            return -100;
          }
          *(uint *)((long)&pMVar11->dims + lVar9) = uVar2;
          memcpy(pvVar19,(void *)((long)iVar16 * pMVar6->cstep * pMVar6->elemsize +
                                 (long)pMVar6->data),(long)(iVar14 * (int)pMVar6->cstep) * _elemsize
                );
          iVar16 = iVar16 + iVar14;
          uVar18 = uVar18 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
          local_c8 = local_c8 + -1;
          lVar9 = lVar9 + 0x48;
        } while (uVar18 < uVar10);
        return 0;
      }
    }
    else if (((uVar2 == 3) && (iVar20 == 1)) || ((uVar2 == 4 && (iVar20 == 2)))) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar20 = pMVar6->w;
        uVar3 = pMVar6->h;
        uVar4 = pMVar6->d;
        uVar5 = pMVar6->c;
        uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        iVar12 = 0;
        uVar18 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar13 = *(int *)((long)pvVar7 + uVar18 * 4);
            if (iVar13 == -0xe9) {
              iVar13 = (int)((ulong)(long)(int)(uVar3 - iVar12) / (uVar10 - uVar18));
            }
          }
          else if (uVar18 == uVar10 - 1) {
            iVar13 = uVar3 - iVar12;
          }
          else {
            iVar13 = *(int *)((long)pvVar8 + uVar18 * 4);
            iVar13 = (iVar13 - iVar12) + (iVar13 >> 0x1f & uVar3);
          }
          pMVar1 = pMVar11 + uVar18;
          Mat::create(pMVar1,iVar20,iVar13,uVar4,uVar5,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          pMVar1->dims = uVar2;
          if (0 < (int)uVar5) {
            uVar10 = 0;
            do {
              if (0 < (int)uVar4) {
                uVar15 = 0;
                do {
                  lVar9 = (long)pMVar6->w * pMVar6->elemsize;
                  memcpy((void *)((long)pMVar1->data +
                                 (long)pMVar1->h * pMVar1->elemsize * (long)pMVar1->w * uVar15 +
                                 pMVar1->cstep * uVar10 * pMVar1->elemsize),
                         (void *)((long)pMVar6->data +
                                 lVar9 * iVar12 + (long)pMVar6->h * uVar15 * lVar9 +
                                 pMVar6->cstep * uVar10 * pMVar6->elemsize),
                         (long)(iVar13 * iVar20) * _elemsize);
                  uVar15 = uVar15 + 1;
                } while (uVar4 != uVar15);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar5);
          }
          iVar12 = iVar12 + iVar13;
          uVar18 = uVar18 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar18 < uVar10);
        return 0;
      }
    }
    else {
      if ((uVar2 != 3 || iVar20 != 2) && (iVar20 != 3 || uVar2 != 4)) {
        if (uVar2 != 4) {
          return 0;
        }
        if (iVar20 != 1) {
          return 0;
        }
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar11;
        if (lVar9 == 0) {
          return 0;
        }
        iVar20 = pMVar6->w;
        iVar12 = pMVar6->h;
        uVar2 = pMVar6->d;
        uVar3 = pMVar6->c;
        uVar18 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        uVar10 = 0;
        iVar13 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar16 = *(int *)((long)pvVar7 + uVar10 * 4);
            if (iVar16 == -0xe9) {
              iVar16 = (int)((ulong)(long)(int)(uVar2 - iVar13) / (uVar18 - uVar10));
            }
          }
          else if (uVar10 == uVar18 - 1) {
            iVar16 = uVar2 - iVar13;
          }
          else {
            iVar16 = *(int *)((long)pvVar8 + uVar10 * 4);
            iVar16 = (iVar16 - iVar13) + (iVar16 >> 0x1f & uVar2);
          }
          pMVar1 = pMVar11 + uVar10;
          Mat::create(pMVar1,iVar20,iVar12,iVar16,uVar3,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            uVar18 = 0;
            do {
              memcpy((void *)(pMVar1->cstep * uVar18 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar6->data +
                             (long)pMVar6->h * pMVar6->elemsize * (long)pMVar6->w * (long)iVar13 +
                             pMVar6->cstep * uVar18 * pMVar6->elemsize),
                     (long)(iVar12 * iVar20 * iVar16) * _elemsize);
              uVar18 = uVar18 + 1;
            } while (uVar3 != uVar18);
          }
          iVar13 = iVar13 + iVar16;
          uVar10 = uVar10 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar18 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar10 < uVar18);
        return 0;
      }
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        uVar3 = pMVar6->w;
        uVar4 = pMVar6->h;
        uVar5 = pMVar6->d;
        _c = pMVar6->c;
        uVar18 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        uVar10 = 0;
        iVar20 = 0;
        do {
          if (pvVar8 == (void *)0x0) {
            iVar12 = *(int *)((long)pvVar7 + uVar10 * 4);
            if (iVar12 == -0xe9) {
              iVar12 = (int)((ulong)(long)(int)(uVar3 - iVar20) / (uVar18 - uVar10));
            }
          }
          else if (uVar10 == uVar18 - 1) {
            iVar12 = uVar3 - iVar20;
          }
          else {
            iVar12 = *(int *)((long)pvVar8 + uVar10 * 4);
            iVar12 = (iVar12 - iVar20) + (iVar12 >> 0x1f & uVar3);
          }
          pMVar1 = pMVar11 + uVar10;
          Mat::create(pMVar1,iVar12,uVar4,uVar5,_c,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          pMVar1->dims = uVar2;
          if (0 < (int)_c) {
            local_a0 = 0;
            do {
              if (0 < (int)uVar5) {
                iVar13 = pMVar6->h;
                pvVar19 = (void *)(pMVar1->cstep * local_a0 * pMVar1->elemsize + (long)pMVar1->data)
                ;
                pvVar21 = (void *)((long)pMVar6->data +
                                  pMVar6->cstep * pMVar6->elemsize * local_a0 +
                                  (long)iVar20 * _elemsize);
                lVar9 = (long)pMVar6->w * pMVar6->elemsize;
                uVar18 = 0;
                do {
                  uVar15 = (ulong)uVar4;
                  __src = pvVar21;
                  if (0 < (int)uVar4) {
                    do {
                      memcpy(pvVar19,__src,(long)iVar12 * _elemsize);
                      pvVar19 = (void *)((long)pvVar19 + (long)iVar12 * _elemsize);
                      __src = (void *)((long)__src + lVar9);
                      uVar15 = uVar15 - 1;
                    } while (uVar15 != 0);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar21 = (void *)((long)pvVar21 + iVar13 * lVar9);
                } while (uVar18 != uVar5);
              }
              local_a0 = local_a0 + 1;
            } while (local_a0 != _c);
          }
          iVar20 = iVar20 + iVar12;
          uVar10 = uVar10 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar18 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar10 < uVar18);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    const int* indices_ptr = indices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = channels - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? channels + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = d - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? d + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((d - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}